

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void FStateDefinitions::FixStatePointers
               (PClassActor *actor,TArray<FStateDefine,_FStateDefine> *list)

{
  FState *pFVar1;
  FState *pFVar2;
  uint uVar3;
  FStateDefine *pFVar4;
  size_t v;
  uint i;
  TArray<FStateDefine,_FStateDefine> *list_local;
  PClassActor *actor_local;
  
  v._4_4_ = 0;
  while( true ) {
    uVar3 = TArray<FStateDefine,_FStateDefine>::Size(list);
    if (uVar3 <= v._4_4_) break;
    pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)v._4_4_);
    if (pFVar4->DefineFlags == '\x05') {
      pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)v._4_4_);
      pFVar1 = pFVar4->State;
      pFVar2 = actor->OwnedStates;
      pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)v._4_4_);
      pFVar4->State = pFVar2 + (long)((long)&pFVar1[-1].Misc2 + 3);
      pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)v._4_4_);
      pFVar4->DefineFlags = '\x01';
    }
    pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)v._4_4_);
    uVar3 = TArray<FStateDefine,_FStateDefine>::Size(&pFVar4->Children);
    if (uVar3 != 0) {
      pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)v._4_4_);
      FixStatePointers(actor,&pFVar4->Children);
    }
    v._4_4_ = v._4_4_ + 1;
  }
  return;
}

Assistant:

void FStateDefinitions::FixStatePointers (PClassActor *actor, TArray<FStateDefine> & list)
{
	for (unsigned i = 0; i < list.Size(); i++)
	{
		if (list[i].DefineFlags == SDF_INDEX)
		{
			size_t v = (size_t)list[i].State;
			list[i].State = actor->OwnedStates + v - 1;
			list[i].DefineFlags = SDF_STATE;
		}
		if (list[i].Children.Size() > 0)
		{
			FixStatePointers(actor, list[i].Children);
		}
	}
}